

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::switch_statement::switch_statement
          (switch_statement *this,source_extend *extend,expression_ptr *e,clause_list *cl)

{
  pointer pcVar1;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__switch_statement_001ca840;
  (this->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (e->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
       super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (e->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  pcVar1 = (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
  super__Vector_impl_data._M_start =
       (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
    return;
  }
  __assert_fail("e_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x353,
                "mjs::switch_statement::switch_statement(const source_extend &, expression_ptr &&, clause_list &&)"
               );
}

Assistant:

explicit switch_statement(const source_extend& extend, expression_ptr&& e, clause_list&& cl) : statement(extend), e_(std::move(e)), cl_(std::move(cl)) {
        assert(e_);
    }